

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IniTest.cpp
# Opt level: O0

void __thiscall
TApp_IniNotRequiredPassedNotFound_Test::TApp_IniNotRequiredPassedNotFound_Test
          (TApp_IniNotRequiredPassedNotFound_Test *this)

{
  TApp_IniNotRequiredPassedNotFound_Test *this_local;
  
  TApp::TApp(&this->super_TApp);
  (this->super_TApp).super_Test._vptr_Test =
       (_func_int **)&PTR__TApp_IniNotRequiredPassedNotFound_Test_001c6a10;
  return;
}

Assistant:

TEST_F(TApp, IniNotRequiredPassedNotFound) {

    std::string noini = "TestIniNotExist.ini";
    app.set_config("--config", "", "", false);

    args = {"--config", noini};
    EXPECT_THROW(run(), CLI::FileError);
}